

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LArNEST.cpp
# Opt level: O3

double __thiscall
NEST::LArNEST::GetNRPhotonYieldsConserved(LArNEST *this,double energy,double efield)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  undefined1 auVar7 [16];
  
  dVar1 = (this->fNR).alpha;
  dVar3 = pow(energy,(this->fNR).beta);
  dVar2 = (this->fNR).gamma;
  dVar4 = pow(efield,(this->fNR).delta);
  dVar5 = (this->fNR).epsilon + energy;
  if (dVar5 < 0.0) {
    dVar5 = sqrt(dVar5);
  }
  else {
    dVar5 = SQRT(dVar5);
  }
  dVar6 = pow(energy / (this->fNR).zeta,(this->fNR).eta);
  auVar7._8_8_ = dVar5;
  auVar7._0_8_ = dVar4 * dVar2;
  auVar7 = divpd(_DAT_001188c0,auVar7);
  return dVar1 * dVar3 + auVar7._8_8_ * auVar7._0_8_ * (-1.0 / (dVar6 + 1.0) + 1.0);
}

Assistant:

double LArNEST::GetNRPhotonYieldsConserved(double energy, double efield) {
  return fNR.alpha * pow(energy, fNR.beta) -
         (1.0 / (fNR.gamma * pow(efield, fNR.delta))) *
             (1.0 / sqrt(energy + fNR.epsilon)) *
             (1.0 - 1.0 / (1.0 + pow(energy / fNR.zeta, fNR.eta)));
}